

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O2

void reuse_on_delete_test(void)

{
  FILE *pFVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  sb_decision_t sVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  char keybuf [256];
  char bodybuf [512];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fconfig.compaction_threshold = '\0';
  fconfig.block_reusing_threshold = 0x41;
  fconfig.num_keeping_headers = 10;
  system("rm -rf  staleblktest* > errorlog.txt");
  fdb_open(&dbfile,"./staleblktest1",&fconfig);
  fdb_kvs_open_default(dbfile,&db,&kvs_config);
  uVar10 = 0;
  while (uVar10 != 0xb) {
    sprintf(keybuf,"%dkey",(ulong)uVar10);
    fillstr(bodybuf,'b',0x200);
    pfVar2 = db;
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4bd);
      reuse_on_delete_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4bd,"void reuse_on_delete_test()");
    }
    fVar3 = fdb_commit(dbfile,'\x01');
    pFVar1 = _stderr;
    uVar10 = uVar10 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4bf);
      reuse_on_delete_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4bf,"void reuse_on_delete_test()");
    }
  }
  uVar8 = 0;
  do {
    sprintf(keybuf,"%dkey",uVar8);
    fillstr(bodybuf,'c',0x80);
    pfVar2 = db;
    sVar5 = strlen(keybuf);
    sVar6 = strlen(bodybuf);
    fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4c9);
      reuse_on_delete_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4c9,"void reuse_on_delete_test()");
    }
    fVar3 = fdb_get_file_info(dbfile,&file_info);
    pFVar1 = _stderr;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4cc);
      reuse_on_delete_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4cc,"void reuse_on_delete_test()");
    }
    uVar10 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar10;
  } while (file_info.file_size < 0x1000000);
  sVar4 = sb_check_block_reusing(db);
  if (sVar4 != SBD_NONE) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x4d2);
    reuse_on_delete_test()::__test_pass = 1;
    __assert_fail("sb_decision == SBD_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x4d2,"void reuse_on_delete_test()");
  }
  fVar3 = fdb_commit(dbfile,'\x01');
  pFVar1 = _stderr;
  if (fVar3 == FDB_RESULT_SUCCESS) {
    uVar9 = 0;
    while (uVar10 != uVar9) {
      sprintf(keybuf,"%dkey",(ulong)uVar9);
      pfVar2 = db;
      sVar5 = strlen(keybuf);
      fVar3 = fdb_del_kv(pfVar2,keybuf,sVar5);
      pFVar1 = _stderr;
      uVar9 = uVar9 + 1;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x4da);
        reuse_on_delete_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x4da,"void reuse_on_delete_test()");
      }
    }
    sVar4 = sb_check_block_reusing(db);
    if (sVar4 != SBD_RECLAIM) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4de);
      reuse_on_delete_test()::__test_pass = 1;
      __assert_fail("sb_decision == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4de,"void reuse_on_delete_test()");
    }
    uVar9 = 0;
    while (uVar9 < uVar10 >> 2) {
      sprintf(keybuf,"%dkey",(ulong)uVar9);
      fillstr(bodybuf,'d',0x80);
      pfVar2 = db;
      sVar5 = strlen(keybuf);
      sVar6 = strlen(bodybuf);
      fVar3 = fdb_set_kv(pfVar2,keybuf,sVar5,bodybuf,sVar6);
      pFVar1 = _stderr;
      uVar9 = uVar9 + 2;
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pcVar7 = fdb_error_msg(fVar3);
        fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x4e7);
        reuse_on_delete_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                      ,0x4e7,"void reuse_on_delete_test()");
      }
    }
    sVar4 = sb_check_block_reusing(db);
    if (sVar4 != SBD_RECLAIM) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4ed);
      reuse_on_delete_test()::__test_pass = 1;
      __assert_fail("sb_decision == SBD_RECLAIM",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4ed,"void reuse_on_delete_test()");
    }
    fVar3 = fdb_close(dbfile);
    pFVar1 = _stderr;
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_shutdown();
      pFVar1 = _stderr;
      if (fVar3 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar7 = "%s PASSED\n";
        if (reuse_on_delete_test()::__test_pass != '\0') {
          pcVar7 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar7,"reuse on delete test");
        return;
      }
      pcVar7 = fdb_error_msg(fVar3);
      fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
              ,0x4f2);
      reuse_on_delete_test()::__test_pass = 1;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                    ,0x4f2,"void reuse_on_delete_test()");
    }
    pcVar7 = fdb_error_msg(fVar3);
    fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
            ,0x4f0);
    reuse_on_delete_test()::__test_pass = 1;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                  ,0x4f0,"void reuse_on_delete_test()");
  }
  pcVar7 = fdb_error_msg(fVar3);
  fprintf(pFVar1,"Test failed with fdb_status %d (%s) at %s %d\n",(ulong)(uint)fVar3,pcVar7,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
          ,0x4d4);
  reuse_on_delete_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/staleblock_test.cc"
                ,0x4d4,"void reuse_on_delete_test()");
}

Assistant:

void reuse_on_delete_test() {
    TEST_INIT();
    memleak_start();

    int i, r, ndocs;
    int nheaders = 10;
    char keybuf[256];
    char bodybuf[512];

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = nheaders;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create num_keeping_headers+1
    for (i = 0; i < nheaders + 1; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    ndocs = i;

    // expect NO REUSE
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_NONE);
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // delete so that file becomes stale
    for (i = 0; i < ndocs; ++i) {
        sprintf(keybuf, "%dkey",i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_STATUS(status);
    }

    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // reload 1/4 all keys again and expect no file size growth
    // since all docs being reused
    for (i = 0; i < ndocs / 4; ++i) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
    }

    // expect to still be in reuse mode
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    status = fdb_close(dbfile);
    TEST_STATUS(status);
    status = fdb_shutdown();
    TEST_STATUS(status);

    memleak_end();
    TEST_RESULT("reuse on delete test");
}